

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  char *k00_1;
  int i_1;
  int k_1;
  char *k00;
  int j;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  int _c;
  undefined8 in_stack_fffffffffffffbd8;
  int _w;
  Mat *in_stack_fffffffffffffbe0;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long *local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  void *local_388;
  int local_380;
  int local_37c;
  undefined8 local_378;
  undefined8 local_370;
  Allocator *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  Mat *in_stack_fffffffffffffcb8;
  undefined4 uVar1;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined4 local_300;
  long local_2f8;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined8 local_2d8;
  undefined1 *local_2d0;
  int local_2c8;
  void *local_2b8;
  int *local_2b0;
  long local_2a8;
  long *local_298;
  int local_28c;
  int local_288;
  long local_278;
  int local_26c;
  int local_260;
  int local_25c;
  long *local_258;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  void **local_230;
  int local_210;
  undefined4 local_20c;
  void **local_208;
  undefined8 *local_1f8;
  undefined8 *local_1e8;
  undefined8 *local_1d8;
  undefined1 local_1cd;
  int local_1cc;
  void **local_1c8;
  undefined8 *local_1c0;
  undefined1 local_19d;
  int local_19c;
  void **local_198;
  undefined8 *local_190;
  undefined1 local_16d;
  int local_16c;
  undefined8 *local_160;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined1 *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 *local_d0;
  void *local_b0;
  undefined8 *local_98;
  void *local_78;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_44;
  long local_40;
  undefined4 local_34;
  long local_30;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  local_26c = in_R8D * in_R9D;
  local_260 = in_ECX;
  local_25c = in_EDX;
  local_258 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffcac,in_stack_fffffffffffffca0);
  _w = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
  if (local_25c < 4) {
    Mat::create(in_stack_fffffffffffffbe0,_w,(int)in_stack_fffffffffffffbd8,_c,
                in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  }
  else {
    Mat::create(in_stack_fffffffffffffbe0,_w,(int)in_stack_fffffffffffffbd8,_c,
                in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  }
  for (local_2c8 = 0; local_2c8 + 3 < local_260; local_2c8 = local_2c8 + 4) {
    local_16c = local_2c8 / 4;
    local_160 = &local_318;
    local_d4 = *(int *)((long)local_258 + 0x2c);
    local_d8 = (int)local_258[6];
    local_dc = *(undefined4 *)((long)local_258 + 0x34);
    local_e8 = (undefined1 *)(*local_258 + local_258[8] * (long)local_16c * local_258[2]);
    local_f0 = local_258[2];
    local_f4 = (undefined4)local_258[3];
    local_100 = local_258[4];
    local_d0 = &local_318;
    local_30 = (long)local_d4 * (long)local_d8 * local_f0;
    local_28 = &local_318;
    local_248 = &local_318;
    local_34 = 0x10;
    local_16d = 1;
    local_318 = 0;
    local_308 = 0;
    local_300 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e4 = 0;
    local_2e0 = 0;
    local_2d8 = 0;
    local_310 = 0;
    local_2d0 = local_e8;
    for (local_31c = 0; local_31c + 3 < local_25c; local_31c = local_31c + 4) {
      for (local_320 = 0; local_320 < local_26c; local_320 = local_320 + 1) {
        for (local_324 = 0; local_324 < 4; local_324 = local_324 + 1) {
          for (local_328 = 0; local_328 < 4; local_328 = local_328 + 1) {
            local_19c = local_2c8 + local_324;
            local_190 = &local_378;
            local_198 = &local_2b8;
            local_b0 = (void *)((long)local_2b8 + local_278 * local_19c * local_2a8);
            local_98 = &local_378;
            uVar1 = 1;
            local_40 = (long)local_28c * (long)(int)in_stack_fffffffffffffcb8 * local_2a8;
            local_c = local_31c + local_328;
            local_8 = &local_378;
            local_240 = &local_378;
            local_44 = 0x10;
            local_19d = 1;
            local_378 = 0;
            uVar1 = 0;
            local_370 = 0;
            *local_2d0 = *(undefined1 *)
                          ((long)local_b0 +
                          (long)local_320 + (long)local_28c * (long)local_c * local_2a8);
            local_2d0 = local_2d0 + 1;
            local_1e8 = local_240;
          }
        }
      }
    }
    for (; local_31c < local_25c; local_31c = local_31c + 1) {
      for (local_37c = 0; local_37c < local_26c; local_37c = local_37c + 1) {
        for (local_380 = 0; local_380 < 4; local_380 = local_380 + 1) {
          local_1cc = local_2c8 + local_380;
          local_1c0 = &local_3d0;
          local_1c8 = &local_2b8;
          local_78 = (void *)((long)local_2b8 + local_278 * local_1cc * local_2a8);
          local_60 = &local_3d0;
          local_3b0 = local_298;
          local_50 = (long)local_28c * (long)local_288 * local_2a8;
          local_54 = 0x10;
          local_1cd = 1;
          local_18 = &local_3d0;
          local_1c = local_31c;
          local_388 = (void *)((long)local_78 + (long)local_28c * (long)local_31c * local_2a8);
          local_238 = &local_3d0;
          local_3d0 = 0;
          local_3c0 = 0;
          local_3b8 = 0;
          local_3a8 = 0;
          local_3a4 = 0;
          local_3a0 = 0;
          local_39c = 0;
          local_398 = 0;
          local_390 = 0;
          local_3c8 = 0;
          *local_2d0 = *(undefined1 *)((long)local_388 + (long)local_37c);
          local_2d0 = local_2d0 + 1;
          local_1f8 = local_238;
        }
      }
    }
    local_1d8 = local_248;
    local_2f8 = local_100;
  }
  local_230 = &local_2b8;
  if (local_2b0 != (int *)0x0) {
    local_20c = 0xffffffff;
    LOCK();
    local_210 = *local_2b0;
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (local_210 == 1) {
      local_208 = local_230;
      if (local_298 == (long *)0x0) {
        if (local_2b8 != (void *)0x0) {
          free(local_2b8);
        }
      }
      else {
        (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (inch >= 4)
        kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4, (size_t)1u);
    else
        kernel_tm.create(4 * maxk, inch, outch / 4, (size_t)1u);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}